

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

Element * __thiscall
Rml::ElementDocument::SearchFocusSubtree(ElementDocument *this,Element *element,bool forward)

{
  CanFocus CVar1;
  int iVar2;
  Element *pEVar3;
  Element *result;
  int child_index;
  int i;
  CanFocus can_focus;
  bool forward_local;
  Element *element_local;
  ElementDocument *this_local;
  
  CVar1 = anon_unknown_0::CanFocusElement(element);
  this_local = (ElementDocument *)element;
  if (CVar1 != Yes) {
    if (CVar1 == NoAndNoChildren) {
      this_local = (ElementDocument *)0x0;
    }
    else {
      for (result._4_4_ = 0; iVar2 = Element::GetNumChildren(element,false), result._4_4_ < iVar2;
          result._4_4_ = result._4_4_ + 1) {
        result._0_4_ = result._4_4_;
        if (!forward) {
          iVar2 = Element::GetNumChildren(element,false);
          result._0_4_ = (iVar2 - result._4_4_) + -1;
        }
        pEVar3 = Element::GetChild(element,(int)result);
        pEVar3 = SearchFocusSubtree(this,pEVar3,forward);
        if (pEVar3 != (Element *)0x0) {
          return pEVar3;
        }
      }
      this_local = (ElementDocument *)0x0;
    }
  }
  return &this_local->super_Element;
}

Assistant:

Element* ElementDocument::SearchFocusSubtree(Element* element, bool forward)
{
	CanFocus can_focus = CanFocusElement(element);
	if (can_focus == CanFocus::Yes)
		return element;
	else if (can_focus == CanFocus::NoAndNoChildren)
		return nullptr;

	for (int i = 0; i < element->GetNumChildren(); i++)
	{
		int child_index = i;
		if (!forward)
			child_index = element->GetNumChildren() - i - 1;
		if (Element* result = SearchFocusSubtree(element->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}